

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDeformer.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::Cluster::Cluster(Cluster *this,uint64_t id,Element *element,Document *doc,string *name)

{
  Scope *this_00;
  Element *el;
  Element *el_00;
  Element *element_00;
  Element *element_01;
  Model *pMVar1;
  pointer ppCVar2;
  allocator local_a1;
  undefined1 local_a0 [64];
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_60;
  WeightArray *local_48;
  WeightIndexArray *local_40;
  Document *local_38;
  
  local_38 = doc;
  Deformer::Deformer(&this->super_Deformer,id,element,doc,name);
  (this->super_Deformer).super_Object._vptr_Object = (_func_int **)&PTR__Cluster_00246058;
  local_48 = &this->weights;
  local_40 = &this->indices;
  (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->transform).a1 = 1.0;
  (this->transform).a2 = 0.0;
  (this->transform).a3 = 0.0;
  (this->transform).a4 = 0.0;
  (this->transform).b1 = 0.0;
  (this->transform).b2 = 1.0;
  (this->transform).b3 = 0.0;
  (this->transform).b4 = 0.0;
  (this->transform).c1 = 0.0;
  (this->transform).c2 = 0.0;
  (this->transform).c3 = 1.0;
  (this->transform).c4 = 0.0;
  (this->transform).d1 = 0.0;
  (this->transform).d2 = 0.0;
  (this->transform).d3 = 0.0;
  *(undefined8 *)&(this->transform).d4 = 0x3f8000003f800000;
  (this->transformLink).a2 = 0.0;
  (this->transformLink).a3 = 0.0;
  (this->transformLink).a4 = 0.0;
  (this->transformLink).b1 = 0.0;
  (this->transformLink).b2 = 1.0;
  (this->transformLink).b3 = 0.0;
  (this->transformLink).b4 = 0.0;
  (this->transformLink).c1 = 0.0;
  (this->transformLink).c2 = 0.0;
  (this->transformLink).c3 = 1.0;
  (this->transformLink).c4 = 0.0;
  (this->transformLink).d1 = 0.0;
  (this->transformLink).d2 = 0.0;
  (this->transformLink).d3 = 0.0;
  (this->transformLink).d4 = 1.0;
  this->node = (Model *)0x0;
  this_00 = GetRequiredScope(element);
  std::__cxx11::string::string((string *)local_a0,"Indexes",(allocator *)&local_60);
  el = Scope::operator[](this_00,(string *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::string((string *)local_a0,"Weights",(allocator *)&local_60);
  el_00 = Scope::operator[](this_00,(string *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::string((string *)local_a0,"Transform",(allocator *)&local_60);
  element_00 = GetRequiredElement(this_00,(string *)local_a0,element);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::string((string *)local_a0,"TransformLink",(allocator *)&local_60);
  element_01 = GetRequiredElement(this_00,(string *)local_a0,element);
  std::__cxx11::string::~string((string *)local_a0);
  ReadMatrix((aiMatrix4x4 *)local_a0,element_00);
  (this->transform).d1 = (float)local_a0._48_4_;
  (this->transform).d2 = (float)local_a0._52_4_;
  (this->transform).d3 = (float)local_a0._56_4_;
  (this->transform).d4 = (float)local_a0._60_4_;
  (this->transform).c1 = (float)local_a0._32_4_;
  (this->transform).c2 = (float)local_a0._36_4_;
  (this->transform).c3 = (float)local_a0._40_4_;
  (this->transform).c4 = (float)local_a0._44_4_;
  (this->transform).b1 = (float)local_a0._16_4_;
  (this->transform).b2 = (float)local_a0._20_4_;
  (this->transform).b3 = (float)local_a0._24_4_;
  (this->transform).b4 = (float)local_a0._28_4_;
  (this->transform).a1 = (float)local_a0._0_4_;
  (this->transform).a2 = (float)local_a0._4_4_;
  (this->transform).a3 = (float)local_a0._8_4_;
  (this->transform).a4 = (float)local_a0._12_4_;
  ReadMatrix((aiMatrix4x4 *)local_a0,element_01);
  (this->transformLink).d1 = (float)local_a0._48_4_;
  (this->transformLink).d2 = (float)local_a0._52_4_;
  (this->transformLink).d3 = (float)local_a0._56_4_;
  (this->transformLink).d4 = (float)local_a0._60_4_;
  (this->transformLink).c1 = (float)local_a0._32_4_;
  (this->transformLink).c2 = (float)local_a0._36_4_;
  (this->transformLink).c3 = (float)local_a0._40_4_;
  (this->transformLink).c4 = (float)local_a0._44_4_;
  (this->transformLink).b1 = (float)local_a0._16_4_;
  (this->transformLink).b2 = (float)local_a0._20_4_;
  (this->transformLink).b3 = (float)local_a0._24_4_;
  (this->transformLink).b4 = (float)local_a0._28_4_;
  (this->transformLink).a1 = (float)local_a0._0_4_;
  (this->transformLink).a2 = (float)local_a0._4_4_;
  (this->transformLink).a3 = (float)local_a0._8_4_;
  (this->transformLink).a4 = (float)local_a0._12_4_;
  if ((el_00 == (Element *)0x0) == (el != (Element *)0x0)) {
    std::__cxx11::string::string
              ((string *)local_a0,"either Indexes or Weights are missing from Cluster",
               (allocator *)&local_60);
    Util::DOMError((string *)local_a0,element);
  }
  if (el != (Element *)0x0) {
    ParseVectorDataArray(local_40,el);
    ParseVectorDataArray(local_48,el_00);
  }
  if ((long)(this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start !=
      (long)(this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start) {
    std::__cxx11::string::string
              ((string *)local_a0,"sizes of index and weight array don\'t match up",
               (allocator *)&local_60);
    Util::DOMError((string *)local_a0,element);
  }
  Document::GetConnectionsByDestinationSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&local_60,local_38,(this->super_Deformer).super_Object.id,"Model");
  ppCVar2 = local_60._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppCVar2 == local_60._M_impl.super__Vector_impl_data._M_finish) {
      if (this->node == (Model *)0x0) {
        std::__cxx11::string::string
                  ((string *)local_a0,"failed to read target Node for Cluster",&local_a1);
        Util::DOMError((string *)local_a0,element);
      }
      goto LAB_00178b28;
    }
    pMVar1 = Util::ProcessSimpleConnection<Assimp::FBX::Model>
                       (*ppCVar2,false,"Model -> Cluster",element,(char **)0x0);
    ppCVar2 = ppCVar2 + 1;
  } while (pMVar1 == (Model *)0x0);
  this->node = pMVar1;
LAB_00178b28:
  std::
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  ~_Vector_base(&local_60);
  return;
}

Assistant:

Cluster::Cluster(uint64_t id, const Element& element, const Document& doc, const std::string& name)
: Deformer(id,element,doc,name)
, node()
{
    const Scope& sc = GetRequiredScope(element);

    const Element* const Indexes = sc["Indexes"];
    const Element* const Weights = sc["Weights"];

    const Element& Transform = GetRequiredElement(sc,"Transform",&element);
    const Element& TransformLink = GetRequiredElement(sc,"TransformLink",&element);

    transform = ReadMatrix(Transform);
    transformLink = ReadMatrix(TransformLink);

    // it is actually possible that there be Deformer's with no weights
    if (!!Indexes != !!Weights) {
        DOMError("either Indexes or Weights are missing from Cluster",&element);
    }

    if(Indexes) {
        ParseVectorDataArray(indices,*Indexes);
        ParseVectorDataArray(weights,*Weights);
    }

    if(indices.size() != weights.size()) {
        DOMError("sizes of index and weight array don't match up",&element);
    }

    // read assigned node
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(),"Model");
    for(const Connection* con : conns) {
        const Model* const mod = ProcessSimpleConnection<Model>(*con, false, "Model -> Cluster", element);
        if(mod) {
            node = mod;
            break;
        }
    }

    if (!node) {
        DOMError("failed to read target Node for Cluster",&element);
    }
}